

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsDatabase.cpp
# Opt level: O0

bool DnsDatabase::resolve(String *hostname,uint32 *addr)

{
  bool bVar1;
  int iVar2;
  Iterator *pIVar3;
  time_t tVar4;
  AddrInfo *pAVar5;
  undefined4 extraout_var;
  undefined1 *this;
  uint32 local_64;
  undefined1 local_58 [8];
  AddrInfo addrInfo_1;
  Iterator local_40;
  Iterator it_1;
  bool result;
  bool result_1;
  AddrInfo *addrInfo;
  Iterator it;
  uint32 *addr_local;
  String *hostname_local;
  
  it.item = (Item *)addr;
  Mutex::lock((Mutex *)(anonymous_namespace)::_mutex);
  addrInfo = (AddrInfo *)
             HashMap<String,_(anonymous_namespace)::AddrInfo>::find
                       ((HashMap<String,_(anonymous_namespace)::AddrInfo> *)
                        (anonymous_namespace)::_nameToAddr,hostname);
  pIVar3 = HashMap<String,_(anonymous_namespace)::AddrInfo>::end
                     ((HashMap<String,_(anonymous_namespace)::AddrInfo> *)
                      (anonymous_namespace)::_nameToAddr);
  bVar1 = HashMap<String,_(anonymous_namespace)::AddrInfo>::Iterator::operator!=
                    ((Iterator *)&addrInfo,pIVar3);
  if (bVar1) {
    pIVar3 = (Iterator *)&addrInfo;
    pAVar5 = HashMap<String,_(anonymous_namespace)::AddrInfo>::Iterator::operator*(pIVar3);
    *(uint32 *)&((it.item)->key).data = pAVar5->addr;
    it_1.item._7_1_ = pAVar5->addr != 0;
    tVar4 = Time::time((time_t *)pIVar3);
    if (tVar4 - pAVar5->timestamp < 0x927c1) {
      Mutex::unlock((Mutex *)(anonymous_namespace)::_mutex);
      it_1.item._6_1_ = it_1.item._7_1_;
      goto LAB_001070b0;
    }
  }
  Mutex::unlock((Mutex *)(anonymous_namespace)::_mutex);
  it_1.item._6_1_ = Socket::getHostByName(hostname,(uint32 *)it.item);
  Mutex::lock((Mutex *)(anonymous_namespace)::_mutex);
  local_40 = HashMap<String,_(anonymous_namespace)::AddrInfo>::find
                       ((HashMap<String,_(anonymous_namespace)::AddrInfo> *)
                        (anonymous_namespace)::_nameToAddr,hostname);
  pIVar3 = HashMap<String,_(anonymous_namespace)::AddrInfo>::end
                     ((HashMap<String,_(anonymous_namespace)::AddrInfo> *)
                      (anonymous_namespace)::_nameToAddr);
  this = (undefined1 *)&local_40;
  bVar1 = HashMap<String,_(anonymous_namespace)::AddrInfo>::Iterator::operator!=
                    ((Iterator *)this,pIVar3);
  if (bVar1) {
    pAVar5 = HashMap<String,_(anonymous_namespace)::AddrInfo>::Iterator::operator->(&local_40);
    if (pAVar5->addr != 0) {
      pAVar5 = HashMap<String,_(anonymous_namespace)::AddrInfo>::Iterator::operator->(&local_40);
      HashMap<unsigned_int,_String>::remove
                ((HashMap<unsigned_int,_String> *)(anonymous_namespace)::_addrToName,(char *)pAVar5)
      ;
    }
    this = (anonymous_namespace)::_nameToAddr;
    iVar2 = HashMap<String,_(anonymous_namespace)::AddrInfo>::remove
                      ((HashMap<String,_(anonymous_namespace)::AddrInfo> *)
                       (anonymous_namespace)::_nameToAddr,(char *)&local_40);
    addrInfo_1.timestamp = CONCAT44(extraout_var,iVar2);
  }
  if ((it_1.item._6_1_ & 1) == 0) {
    local_64 = 0;
  }
  else {
    local_64 = *(uint32 *)&((it.item)->key).data;
  }
  local_58._0_4_ = local_64;
  addrInfo_1._0_8_ = Time::time((time_t *)this);
  HashMap<String,_(anonymous_namespace)::AddrInfo>::append
            ((HashMap<String,_(anonymous_namespace)::AddrInfo> *)(anonymous_namespace)::_nameToAddr,
             hostname,(AddrInfo *)local_58);
  if ((it_1.item._6_1_ & 1) != 0) {
    HashMap<unsigned_int,_String>::append
              ((HashMap<unsigned_int,_String> *)(anonymous_namespace)::_addrToName,(uint *)it.item,
               hostname);
  }
  Mutex::unlock((Mutex *)(anonymous_namespace)::_mutex);
LAB_001070b0:
  hostname_local._7_1_ = (bool)(it_1.item._6_1_ & 1);
  return hostname_local._7_1_;
}

Assistant:

bool DnsDatabase::resolve(const String& hostname, uint32& addr)
{
    {
        _mutex.lock();
        HashMap<String, AddrInfo>::Iterator it = _nameToAddr.find(hostname);
        if (it != _nameToAddr.end())
        {
            const AddrInfo& addrInfo = *it;
            addr = addrInfo.addr;
            bool result = addrInfo.addr != 0;
            if (Time::time() - addrInfo.timestamp <= 10 * 60 * 1000) // the cached entry should not be older than 10 minutes
            {
                _mutex.unlock();
                return result;
            }
        }
        _mutex.unlock();
    }

    bool result = Socket::getHostByName(hostname, addr);

    {
        _mutex.lock();
        HashMap<String, AddrInfo>::Iterator it = _nameToAddr.find(hostname);
        if (it != _nameToAddr.end())
        {
            if (it->addr != 0)
                _addrToName.remove(it->addr);
            _nameToAddr.remove(it);
        }
        AddrInfo addrInfo = {result ? addr : 0, Time::time()};
        _nameToAddr.append(hostname, addrInfo);
        if (result)
            _addrToName.append(addr, hostname);
        _mutex.unlock();
    }

    return result;
}